

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
ValidatorTest_MissingCatchTag_Test::TestBody(ValidatorTest_MissingCatchTag_Test *this)

{
  byte bVar1;
  bool bVar2;
  ArenaVector<wasm::Name> *this_00;
  Const *item;
  char *message;
  char *in_R9;
  string local_6b0;
  AssertHelper local_690;
  Message local_688;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_;
  undefined1 local_660 [4];
  Flags flags;
  Function function;
  Const *catchBodyExp;
  Literal local_458;
  id local_440;
  Const *bodyExp;
  Try *local_428;
  Try *tryExp;
  FeatureSet local_40c;
  undefined1 local_408 [8];
  Module module;
  WasmValidator validator;
  ValidatorTest_MissingCatchTag_Test *this_local;
  
  ::wasm::Module::Module((Module *)local_408);
  ::wasm::FeatureSet::FeatureSet(&local_40c,0x40);
  ::wasm::FeatureSet::enable
            ((FeatureSet *)
             &module.debugInfoSourcesContent.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_40c);
  local_428 = MixedArena::alloc<wasm::Try>((MixedArena *)&module.typeIndices._M_h._M_single_bucket);
  ::wasm::Name::Name((Name *)&bodyExp,"tst1");
  ::wasm::Name::operator=(&local_428->name,(Name *)&bodyExp);
  local_440._M_thread =
       (native_handle_type)
       MixedArena::alloc<wasm::Const>((MixedArena *)&module.typeIndices._M_h._M_single_bucket);
  ::wasm::Literal::Literal(&local_458,1);
  ::wasm::Literal::operator=((Literal *)(local_440._M_thread + 0x10),&local_458);
  ::wasm::Literal::~Literal(&local_458);
  local_428->body = (Expression *)local_440._M_thread;
  this_00 = &local_428->catchTags;
  ::wasm::Name::Name((Name *)&catchBodyExp,"foo");
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
            (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
             (Name)_catchBodyExp);
  item = MixedArena::alloc<wasm::Const>((MixedArena *)&module.typeIndices._M_h._M_single_bucket);
  ::wasm::Literal::Literal((Literal *)&function.noFullInline,2);
  ::wasm::Literal::operator=(&item->value,(Literal *)&function.noFullInline);
  ::wasm::Literal::~Literal((Literal *)&function.noFullInline);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(local_428->catchBodies).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  memset((Function *)local_660,0,0x1d8);
  ::wasm::Function::Function((Function *)local_660);
  function.vars.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_428;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 6;
  bVar1 = ::wasm::WasmValidator::validate
                    ((Function *)((long)&module.tagsMap._M_h._M_single_bucket + 7),
                     (Module *)local_660,(uint)local_408);
  local_679 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_678,&local_679,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar2) {
    testing::Message::Message(&local_688);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6b0,(internal *)local_678,
               (AssertionResult *)"validator.validate(&function, module, flags)","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_690,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/validator.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=(&local_690,&local_688);
    testing::internal::AssertHelper::~AssertHelper(&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    testing::Message::~Message(&local_688);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  ::wasm::Function::~Function((Function *)local_660);
  ::wasm::Module::~Module((Module *)local_408);
  return;
}

Assistant:

TEST(ValidatorTest, MissingCatchTag) {
  WasmValidator validator;
  Module module;
  module.features.enable(FeatureSet::ExceptionHandling);
  auto tryExp = module.allocator.alloc<Try>();
  tryExp->name = "tst1";
  auto bodyExp = module.allocator.alloc<Const>();
  bodyExp->value = Literal(1);
  tryExp->body = bodyExp;
  tryExp->catchTags.push_back(wasm::Name("foo"));
  auto catchBodyExp = module.allocator.alloc<Const>();
  catchBodyExp->value = Literal(2);
  tryExp->catchBodies.push_back(catchBodyExp);
  Function function = Function();
  function.body = tryExp;
  WasmValidator::Flags flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(validator.validate(&function, module, flags));
}